

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.cc
# Opt level: O0

Generator * __thiscall kratos::Context::generator(Context *this,string *name)

{
  set<std::shared_ptr<kratos::Generator>,std::less<std::shared_ptr<kratos::Generator>>,std::allocator<std::shared_ptr<kratos::Generator>>>
  *this_00;
  element_type *peVar1;
  Context *local_38;
  shared_ptr<kratos::Generator> local_30;
  undefined8 local_20;
  shared_ptr<kratos::Generator> *p;
  string *name_local;
  Context *this_local;
  
  local_38 = this;
  p = (shared_ptr<kratos::Generator> *)name;
  name_local = (string *)this;
  std::make_shared<kratos::Generator,kratos::Context*,std::__cxx11::string_const&>
            ((Context **)&local_30,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_38);
  local_20 = (__shared_ptr_access<kratos::Generator,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &local_30;
  this_00 = (set<std::shared_ptr<kratos::Generator>,std::less<std::shared_ptr<kratos::Generator>>,std::allocator<std::shared_ptr<kratos::Generator>>>
             *)std::
               unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::shared_ptr<kratos::Generator>,_std::less<std::shared_ptr<kratos::Generator>_>,_std::allocator<std::shared_ptr<kratos::Generator>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::shared_ptr<kratos::Generator>,_std::less<std::shared_ptr<kratos::Generator>_>,_std::allocator<std::shared_ptr<kratos::Generator>_>_>_>_>_>
               ::operator[](&this->modules_,(key_type *)p);
  std::
  set<std::shared_ptr<kratos::Generator>,std::less<std::shared_ptr<kratos::Generator>>,std::allocator<std::shared_ptr<kratos::Generator>>>
  ::emplace<std::shared_ptr<kratos::Generator>const&>
            (this_00,(shared_ptr<kratos::Generator> *)local_20);
  peVar1 = std::__shared_ptr_access<kratos::Generator,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator*((__shared_ptr_access<kratos::Generator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)local_20);
  std::shared_ptr<kratos::Generator>::~shared_ptr(&local_30);
  return peVar1;
}

Assistant:

Generator &Context::generator(const std::string &name) {
    auto const &p = std::make_shared<Generator>(this, name);
    modules_[name].emplace(p);
    return *p;
}